

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# align_code.cpp
# Opt level: O0

void __thiscall
backend::codegen::CodeAlignOptimization::optimize_func
          (CodeAlignOptimization *this,Function *f,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  size_type sVar1;
  pointer pIVar2;
  long lVar3;
  ulong uVar4;
  iterator __args;
  long in_RSI;
  bool bVar5;
  exception *i_1;
  int bb_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  size_type bb_id_idx;
  Inst *inst;
  uint32_t totalInstNum;
  uint32_t cmpuInstNum;
  LabelInst *x;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  i;
  size_t index;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  inst_new;
  mapped_type cycle_set;
  key_type *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  iterator in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  key_type *in_stack_fffffffffffffe68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *in_stack_fffffffffffffe70;
  long local_180;
  bool *in_stack_fffffffffffffeb8;
  int *in_stack_fffffffffffffec0;
  _Self local_128;
  int local_11c;
  string local_118 [32];
  undefined8 local_f8;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_f0;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_e8;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_e0;
  pointer local_d8;
  uint local_d0;
  int local_cc;
  long local_c8;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_c0;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_b8;
  ulong local_b0;
  long local_10;
  
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::at(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::
  any_cast<std::unordered_map<std::__cxx11::string,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>>>
            ((any *)in_stack_fffffffffffffe58._M_node);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
        *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe50,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe48);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                    *)0x234b26);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            *)0x234b33);
  local_b0 = 0;
  do {
    uVar4 = local_b0;
    sVar1 = std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)(local_10 + 0x28));
    if (sVar1 <= uVar4) {
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::operator=((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                  (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_fffffffffffffe58._M_node);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::~vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x235087);
      return;
    }
    local_c0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
               std::
               vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
               ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)in_stack_fffffffffffffe48);
    local_b8 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
               ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                            *)in_stack_fffffffffffffe58._M_node,
                           (difference_type)in_stack_fffffffffffffe50);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator->(&local_b8);
    pIVar2 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::get
                       ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                        in_stack_fffffffffffffe50);
    if (pIVar2 == (pointer)0x0) {
      local_180 = 0;
    }
    else {
      local_180 = __dynamic_cast(pIVar2,&arm::Inst::typeinfo,&arm::LabelInst::typeinfo,0);
    }
    local_c8 = local_180;
    if ((local_180 != 0) &&
       (lVar3 = std::__cxx11::string::find((char *)(local_180 + 0x10),0x2cc755), lVar3 == 0)) {
      local_cc = 0;
      local_d0 = 1;
      while( true ) {
        bVar5 = false;
        if (local_d0 < 7) {
          uVar4 = local_b0 + local_d0;
          sVar1 = std::
                  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  ::size((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                          *)(local_10 + 0x28));
          bVar5 = uVar4 < sVar1;
        }
        if (!bVar5) break;
        local_f0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                   std::
                   vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                            *)in_stack_fffffffffffffe48);
        local_e8 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                   __gnu_cxx::
                   __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                   ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                *)in_stack_fffffffffffffe58._M_node,
                               (difference_type)in_stack_fffffffffffffe50);
        local_e0 = __gnu_cxx::
                   __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                   ::operator+((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                *)in_stack_fffffffffffffe58._M_node,
                               (difference_type)in_stack_fffffffffffffe50);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
        ::operator->(&local_e0);
        local_d8 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::get
                             ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                              in_stack_fffffffffffffe50);
        if (((((local_d8->op != LdR) && (local_d8->op != LdM)) && (local_d8->op != StR)) &&
            ((local_d8->op != StM && (local_d8->op != Push)))) && (local_d8->op != Pop)) {
          if (((local_d8->op == B) || (local_d8->op == Bl)) ||
             ((local_d8->op == Bx || ((local_d8->op == Cbz || (local_d8->op == Cbnz)))))) break;
          local_cc = local_cc + 1;
        }
        local_d0 = local_d0 + 1;
      }
      if (4 < local_d0) {
        local_f8 = std::__cxx11::string::find_last_of((char *)(local_c8 + 0x10),0x2cd0f0);
        std::__cxx11::string::substr((ulong)local_118,local_c8 + 0x10);
        in_stack_fffffffffffffe64 =
             std::__cxx11::stoi(in_stack_fffffffffffffe50,(size_t *)in_stack_fffffffffffffe48,0);
        local_11c = in_stack_fffffffffffffe64;
        in_stack_fffffffffffffe58 =
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       (in_stack_fffffffffffffe58._M_node,
                        (key_type_conflict *)in_stack_fffffffffffffe50);
        local_128._M_node = in_stack_fffffffffffffe58._M_node;
        __args = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                           ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)in_stack_fffffffffffffe48);
        bVar5 = std::operator!=(&local_128,(_Self *)&stack0xfffffffffffffec8);
        if (bVar5) {
          std::make_unique<arm::CtrlInst,char_const(&)[6],int,bool>
                    ((char (*) [6])__args._M_node,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffe50 = (string *)&stack0xfffffffffffffec0;
          std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
          unique_ptr<arm::CtrlInst,std::default_delete<arm::CtrlInst>,void>
                    ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     (unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_> *)
                     in_stack_fffffffffffffe58._M_node);
          std::
          vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
          std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
                    ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          std::unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_>::~unique_ptr
                    ((unique_ptr<arm::CtrlInst,_std::default_delete<arm::CtrlInst>_> *)
                     in_stack_fffffffffffffe50);
        }
        std::__cxx11::string::~string(local_118);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator*(&local_b8);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffe50,(value_type *)in_stack_fffffffffffffe48);
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

void CodeAlignOptimization::optimize_func(
    arm::Function &f, std::map<std::string, std::any> &extra_data_repo) {
  auto cycle_set = std::any_cast<optimization::CycleStartType>(
                       extra_data_repo.at(optimization::CYCLE_START_DATA_NAME))
                       .at(f.name);
  std::vector<std::unique_ptr<arm::Inst>> inst_new;
  for (size_t index = 0; index < f.inst.size(); index++) {
    auto i = f.inst.begin() + index;
    if (auto x = dynamic_cast<arm::LabelInst *>(i->get())) {
      if (x->label.find(".bb_") == 0) {
        uint32_t cmpuInstNum;
        uint32_t totalInstNum;

        cmpuInstNum = 0;
        for (totalInstNum = 1;
             totalInstNum <= 6 && index + totalInstNum < f.inst.size();
             totalInstNum++) {
          arm::Inst *inst = (f.inst.begin() + index + totalInstNum)->get();
          if (inst->op == arm::OpCode::LdR || inst->op == arm::OpCode::LdM ||
              inst->op == arm::OpCode::StR || inst->op == arm::OpCode::StM ||
              inst->op == arm::OpCode::Push || inst->op == arm::OpCode::Pop) {
          } else if (inst->op == arm::OpCode::B ||
                     inst->op == arm::OpCode::Bl ||
                     inst->op == arm::OpCode::Bx ||
                     inst->op == arm::OpCode::Cbz ||
                     inst->op == arm::OpCode::Cbnz) {
            break;
          } else {
            cmpuInstNum++;
          }
        }

        if (totalInstNum >= 5) {
          try {
            auto bb_id_idx = x->label.find_last_of("$");
            auto id_str = x->label.substr(bb_id_idx + 1);
            auto bb_id = std::stoi(id_str);
            if (cycle_set.find(bb_id) != cycle_set.end()) {
              inst_new.push_back(std::make_unique<CtrlInst>("align", 7, true));
            }
          } catch (std::exception &i) {
          }
        }
      }
    }
    inst_new.push_back(std::move(*i));
  }
  f.inst = std::move(inst_new);
}